

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O1

void amrex::parser_ast_get_symbols
               (parser_node *node,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *symbols,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *param_3)

{
  parser_node_t pVar1;
  parser_node_t __val;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  size_type *psVar5;
  ulong uVar6;
  uint __len;
  string __str;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
LAB_0066bc00:
  pVar1 = node->type;
  switch(pVar1) {
  case PARSER_NUMBER:
    goto switchD_0066bc15_caseD_1;
  case PARSER_SYMBOL:
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_emplace_unique<char*&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)symbols,(char **)&node->l);
    return;
  case PARSER_ADD:
  case PARSER_SUB:
  case PARSER_MUL:
  case PARSER_DIV:
  case PARSER_F2:
  case PARSER_LIST:
  case PARSER_ADD_PP:
  case PARSER_SUB_PP:
  case PARSER_MUL_PP:
  case PARSER_DIV_PP:
    parser_ast_get_symbols(node->l,symbols,param_3);
    break;
  case PARSER_NEG:
  case PARSER_F1:
  case PARSER_NEG_P:
    node = node->l;
    goto LAB_0066bc00;
  case PARSER_F3:
    goto switchD_0066bc15_caseD_a;
  case PARSER_ASSIGN:
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_emplace_unique<char*&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)param_3,(char **)&node->l->l);
    break;
  case PARSER_ADD_VP:
  case PARSER_SUB_VP:
  case PARSER_MUL_VP:
  case PARSER_DIV_VP:
    break;
  default:
    __val = -pVar1;
    if (0 < (int)pVar1) {
      __val = pVar1;
    }
    __len = 1;
    if (__val < PARSER_F3) goto LAB_0066bcdc;
    uVar6 = (ulong)__val;
    uVar2 = 4;
    goto LAB_0066bca4;
  }
  node = node->r;
  goto LAB_0066bc00;
LAB_0066bca4:
  __len = uVar2;
  uVar4 = (uint)uVar6;
  if (uVar4 < 100) {
    __len = __len - 2;
    goto LAB_0066bcdc;
  }
  if (uVar4 < 1000) {
    __len = __len - 1;
    goto LAB_0066bcdc;
  }
  if (uVar4 < 10000) goto LAB_0066bcdc;
  uVar6 = uVar6 / 10000;
  uVar2 = __len + 4;
  if (uVar4 < 100000) {
    __len = __len + 1;
LAB_0066bcdc:
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)pVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_50[0] + (ulong)(pVar1 >> 0x1f)),__len,__val);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x6bbae2);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70.field_2._8_8_ = plVar3[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_70._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    Abort(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
switchD_0066bc15_caseD_1:
    return;
  }
  goto LAB_0066bca4;
switchD_0066bc15_caseD_a:
  parser_ast_get_symbols(node->l,symbols,param_3);
  parser_ast_get_symbols(node->r,symbols,param_3);
  node = (node->lvp).n;
  goto LAB_0066bc00;
}

Assistant:

void parser_ast_get_symbols (struct parser_node* node, std::set<std::string>& symbols,
                             std::set<std::string>& local_symbols)
{
    switch (node->type)
    {
    case PARSER_NUMBER:
        break;
    case PARSER_SYMBOL:
        symbols.emplace(((struct parser_symbol*)node)->name);
        break;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
    case PARSER_LIST:
        parser_ast_get_symbols(node->l, symbols, local_symbols);
        parser_ast_get_symbols(node->r, symbols, local_symbols);
        break;
    case PARSER_NEG:
    case PARSER_NEG_P:
        parser_ast_get_symbols(node->l, symbols, local_symbols);
        break;
    case PARSER_F1:
        parser_ast_get_symbols(((struct parser_f1*)node)->l, symbols, local_symbols);
        break;
    case PARSER_F2:
        parser_ast_get_symbols(((struct parser_f2*)node)->l, symbols, local_symbols);
        parser_ast_get_symbols(((struct parser_f2*)node)->r, symbols, local_symbols);
        break;
    case PARSER_F3:
        parser_ast_get_symbols(((struct parser_f3*)node)->n1, symbols, local_symbols);
        parser_ast_get_symbols(((struct parser_f3*)node)->n2, symbols, local_symbols);
        parser_ast_get_symbols(((struct parser_f3*)node)->n3, symbols, local_symbols);
        break;
    case PARSER_ASSIGN:
        local_symbols.emplace(((struct parser_assign*)node)->s->name);
        parser_ast_get_symbols(((struct parser_assign*)node)->v, symbols, local_symbols);
        break;
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
        parser_ast_get_symbols(node->r, symbols, local_symbols);
        break;
    default:
        amrex::Abort("parser_ast_get_symbols: unknown node type " + std::to_string(node->type));
    }
}